

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetIterator2(JSContext *ctx,JSValue obj,JSValue method)

{
  JSValue JVar1;
  int iVar2;
  JSContext *in_RCX;
  JSValueUnion in_RDX;
  int64_t in_RSI;
  undefined8 in_RDI;
  JSValueUnion in_R8;
  JSValue JVar3;
  JSValue JVar4;
  JSValue *in_stack_00000010;
  JSValue enum_obj;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion JVar5;
  int64_t in_stack_fffffffffffffff0;
  int64_t local_8;
  
  JVar3.tag = in_stack_fffffffffffffff0;
  JVar3.u.float64 = in_RDX.float64;
  JVar4.tag = in_RSI;
  JVar4.u.float64 = in_R8.float64;
  JVar3 = JS_Call(in_RCX,JVar3,JVar4,(int)((ulong)in_RDI >> 0x20),in_stack_00000010);
  JVar5 = JVar3.u;
  local_8 = JVar3.tag;
  JVar4 = JVar3;
  iVar2 = JS_IsException(JVar3);
  if ((iVar2 == 0) && (iVar2 = JS_IsObject(JVar3), iVar2 == 0)) {
    JS_FreeValue(in_stack_ffffffffffffffa0,JVar4);
    JVar4 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x165d62);
    JVar5 = JVar4.u;
    local_8 = JVar4.tag;
  }
  JVar1.tag = local_8;
  JVar1.u.float64 = JVar5.float64;
  return JVar1;
}

Assistant:

static JSValue JS_GetIterator2(JSContext *ctx, JSValueConst obj,
                               JSValueConst method)
{
    JSValue enum_obj;

    enum_obj = JS_Call(ctx, method, obj, 0, NULL);
    if (JS_IsException(enum_obj))
        return enum_obj;
    if (!JS_IsObject(enum_obj)) {
        JS_FreeValue(ctx, enum_obj);
        return JS_ThrowTypeErrorNotAnObject(ctx);
    }
    return enum_obj;
}